

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char cVar1;
  size_type sVar2;
  mapped_type *this_01;
  size_type n;
  string *this_02;
  allocator local_b1;
  StringPiece prefix;
  string local_90;
  StringPiece package;
  string local_50;
  
  sVar2 = stringpiece_internal::StringPiece::find(line,'=',0);
  n = (size_type)(int)sVar2;
  if (n == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((string *)&package,"Expected prefixes file line without equal sign: \'",&local_b1);
    stringpiece_internal::StringPiece::ToString_abi_cxx11_((string *)&prefix,line);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&package,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix);
    std::operator+(&local_50,&local_90,"\'.");
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&prefix);
    this_02 = (string *)&package;
  }
  else {
    package = stringpiece_internal::StringPiece::substr(line,0,n);
    prefix = stringpiece_internal::StringPiece::substr
                       (line,(long)((sVar2 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
    TrimWhitespace(&package);
    TrimWhitespace(&prefix);
    if ((1 < prefix.length_) && ((*prefix.ptr_ == '\'' || (*prefix.ptr_ == '\"')))) {
      cVar1 = stringpiece_internal::StringPiece::operator[](&prefix,prefix.length_ - 1);
      if (cVar1 == *prefix.ptr_) {
        stringpiece_internal::StringPiece::remove_prefix(&prefix,1);
        stringpiece_internal::StringPiece::remove_suffix(&prefix,1);
      }
    }
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&prefix);
    this_00 = this->prefix_map_;
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_90,&package);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_90);
    this_02 = &local_50;
    std::__cxx11::string::operator=((string *)this_01,(string *)this_02);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)this_02);
  return n != 0xffffffffffffffff;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error = std::string("Expected prefixes file line without equal sign: '") +
                 std::string(line) + "'.";
    return false;
  }
  StringPiece package = line.substr(0, offset);
  StringPiece prefix = line.substr(offset + 1);
  TrimWhitespace(&package);
  TrimWhitespace(&prefix);
  MaybeUnQuote(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[std::string(package)] = std::string(prefix);
  return true;
}